

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bean_ptr_impl.hpp
# Opt level: O0

void __thiscall hiberlite::real_bean<Person>::destroy(real_bean<Person> *this)

{
  Person *this_00;
  bean_key local_28;
  real_bean<Person> *local_10;
  real_bean<Person> *this_local;
  
  if ((this->forgotten & 1U) == 0) {
    local_10 = this;
    bean_key::bean_key(&local_28,&this->key);
    Database::dbDelete<Person>(&local_28,this->obj);
    bean_key::~bean_key(&local_28);
    this_00 = this->obj;
    if (this_00 != (Person *)0x0) {
      Person::~Person(this_00);
      operator_delete(this_00);
    }
    this->forgotten = true;
    this->obj = (Person *)0x0;
    (this->key).id = -1;
  }
  return;
}

Assistant:

void real_bean<C>::destroy() {
	if(forgotten)
		return;
	Database::dbDelete(key, *obj);
	delete obj;
	forgotten=true;
	obj=NULL;
	key.id=Database::NULL_ID;
}